

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O3

void __thiscall
Fastzip::packZipData
          (Fastzip *this,File *f,int size,PackFormat inFormat,PackFormat outFormat,uint8_t *sha,
          ZipEntry *target)

{
  uchar *puVar1;
  File *pFVar2;
  uint8_t *sha_00;
  uint32_t uVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  size_t sVar7;
  int64_t iVar8;
  long *plVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  uint **ppuVar12;
  size_type *psVar13;
  undefined4 in_register_00000084;
  ulong uVar14;
  size_t __n;
  ulong uVar15;
  undefined1 local_140 [16];
  uint *local_130;
  long lStack_128;
  long local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Fastzip *local_98;
  long *local_90 [2];
  long local_80 [2];
  undefined8 local_70;
  uint32_t *local_68;
  File *local_60;
  ulong local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  ulong local_40;
  int local_34;
  
  local_70 = CONCAT44(in_register_00000084,outFormat);
  local_68 = (uint32_t *)CONCAT44(local_68._4_4_,inFormat);
  uVar15 = (ulong)size;
  uVar14 = (ulong)((size / 0x3fff) * 5 + size + 0x10005);
  local_98 = this;
  local_40 = uVar14;
  local_34 = size;
  puVar5 = (uint8_t *)operator_new__(uVar14);
  memset(puVar5,0,uVar14);
  target->store = false;
  local_58 = uVar15;
  if (size == 0) {
    store_uncompressed((File *)f->fp_,0,puVar5,&local_40,&target->crc,sha);
    puVar1 = (target->data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (target->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar5;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
    target->store = true;
    local_40 = 0;
    goto LAB_0011c9e6;
  }
  local_60 = f;
  local_50 = sha;
  local_48 = puVar5;
  if ((int)local_68 == 0) {
    lVar6 = ftell((FILE *)f->fp_);
    iVar4 = local_34;
    if ((int)local_70 - 1U < 9) {
      __n = (size_t)local_34;
      puVar5 = local_48 + (uVar14 - __n);
      local_e0 = lVar6;
      local_68 = &target->crc;
      sVar7 = fread(puVar5,1,__n,(FILE *)f->fp_);
      if ((int)sVar7 != iVar4) {
LAB_0011c6ef:
        local_40 = uVar14 + 7 >> 3;
        local_90[0] = local_80;
        local_58 = __n;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"Compression failed! Storing \'","");
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)local_90,(ulong)(target->name)._M_dataplus._M_p);
        pFVar2 = local_60;
        ppuVar12 = (uint **)(puVar10 + 2);
        if ((uint **)*puVar10 == ppuVar12) {
          local_130 = *ppuVar12;
          lStack_128 = puVar10[3];
          local_140._0_8_ = &local_130;
        }
        else {
          local_130 = *ppuVar12;
          local_140._0_8_ = (uint **)*puVar10;
        }
        local_140._8_8_ = puVar10[1];
        *puVar10 = ppuVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append(local_140);
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d8.field_2._M_allocated_capacity = *psVar13;
          local_d8.field_2._8_4_ = (undefined4)plVar9[3];
          local_d8.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar13;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((local_98->warning).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0011ca10:
          uVar11 = std::__throw_bad_function_call();
          if ((uint **)local_140._0_8_ != &local_130) {
            operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          operator_delete__(local_48);
          _Unwind_Resume(uVar11);
        }
        (*(local_98->warning)._M_invoker)((_Any_data *)&local_98->warning,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        puVar5 = local_50;
        if ((uint **)local_140._0_8_ != &local_130) {
          operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        fseek((FILE *)pFVar2->fp_,local_e0,0);
        store_uncompressed((File *)pFVar2->fp_,local_34,local_48,&local_40,local_68,puVar5);
        __n = local_58;
        goto LAB_0011c9bf;
      }
      if (local_50 != (uint8_t *)0x0) {
        SHA1_Init((SHA_CTX *)local_140);
        SHA1_Update((SHA_CTX *)local_140,puVar5,__n);
        SHA1_Final(local_50,(SHA_CTX *)local_140);
      }
      uVar3 = crc32_fast(puVar5,__n,0);
      *local_68 = uVar3;
      iVar8 = iz_deflate((int)local_70,(char *)local_48,(char *)puVar5,uVar14,__n);
      if (iVar8 == -1) goto LAB_0011c6ef;
      if (iVar8 == -2) {
        local_40 = (ulong)(long)(local_34 << 3) >> 3;
        goto LAB_0011c9bf;
      }
      local_40 = iVar8 + 7U >> 3;
    }
    else {
      store_uncompressed((File *)f->fp_,local_34,local_48,&local_40,&target->crc,local_50);
      __n = local_58;
LAB_0011c9bf:
      target->store = true;
    }
    target->originalSize = __n;
    puVar5 = local_48;
  }
  else if ((int)local_70 == 10 && 0 < (int)local_68) {
    store_compressed((File *)f->fp_,local_34,puVar5,sha);
    local_40 = local_58;
  }
  else {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Unpacking not supported, storing \'","");
    uVar14 = local_58;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_90,(ulong)(target->name)._M_dataplus._M_p);
    ppuVar12 = (uint **)(plVar9 + 2);
    if ((uint **)*plVar9 == ppuVar12) {
      local_130 = *ppuVar12;
      lStack_128 = plVar9[3];
      local_140._0_8_ = &local_130;
    }
    else {
      local_130 = *ppuVar12;
      local_140._0_8_ = (uint **)*plVar9;
    }
    local_140._8_8_ = plVar9[1];
    *plVar9 = (long)ppuVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_140);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8.field_2._8_4_ = (undefined4)plVar9[3];
      local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((local_98->warning).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      goto LAB_0011ca10;
    }
    (*(local_98->warning)._M_invoker)((_Any_data *)&local_98->warning,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    sha_00 = local_50;
    if ((uint **)local_140._0_8_ != &local_130) {
      operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    puVar5 = local_48;
    iVar4 = store_compressed((File *)local_60->fp_,local_34,local_48,sha_00);
    target->originalSize = (long)iVar4;
    local_40 = uVar14;
  }
  puVar1 = (target->data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (target->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar5;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
LAB_0011c9e6:
  target->dataSize = local_40;
  return;
}

Assistant:

void Fastzip::packZipData(File& f, int size, PackFormat inFormat,
                          PackFormat outFormat, uint8_t* sha, ZipEntry& target)
{
    // Maximum size for deflate + space for buffer
    size_t outSize = size + (size / 16383 + 1) * 5 + 64 * 1024;
    auto outBuf = std::make_unique<uint8_t[]>(outSize);
    // auto outBuf = std::make_unique<uint8_t[]>(outSize);
    target.store = false;

    if (size == 0) {
        store_uncompressed(f, 0, outBuf.get(), &outSize, &target.crc, sha);
        target.data = std::move(outBuf);
        target.store = true;
        target.dataSize = 0;
        return;
    }

    if (inFormat == UNCOMPRESSED) {
        auto startPos = f.tell();
        PackResult state;

        if (outFormat >= ZIP1_COMPRESSED && outFormat <= ZIP9_COMPRESSED) {
            state = infozip_deflate(outFormat, f, size, outBuf.get(), &outSize,
                                    &target.crc, sha);
            outSize = (outSize + 7) >> 3;
        }
#ifdef WITH_INTEL
        else if (outFormat == INTEL_COMPRESSED)
            state = intel_deflate(f, size, outBuf.get(), &outSize, &target.crc,
                                  sha, earlyOut);
#endif
        else
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);

        if (state == PackResult::FAILED) {
            warning(string("Compression failed! Storing '") + target.name +
                    "' as a fallback");
            f.seek(startPos);
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);
        }
        if (state == PackResult::STORED)
            target.store = true;
        target.originalSize = size;
    } else if (inFormat > 0 && outFormat == COMPRESSED) {
        // Keep format, just inflate to calculate sha if necessary
        store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    } else {
        // Unpacking is not supported
        warning(string("Unpacking not supported, storing '") + target.name +
                "' with original compression");
        target.originalSize = store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    }

    target.data = std::move(outBuf);
    target.dataSize = outSize;
}